

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTP.h
# Opt level: O2

ArrayTP<int,_5> * __thiscall
L14_4::ArrayTP<L14_4::ArrayTP<int,_5>,_10>::operator[]
          (ArrayTP<int,_5> *__return_storage_ptr__,ArrayTP<L14_4::ArrayTP<int,_5>,_10> *this,int i)

{
  int *piVar1;
  undefined8 uVar2;
  
  if ((uint)i < 0xb) {
    __return_storage_ptr__->_vptr_ArrayTP = (_func_int **)&PTR_operator___0012fa68;
    piVar1 = this->ar[(uint)i].ar;
    uVar2 = *(undefined8 *)(piVar1 + 2);
    *(undefined8 *)__return_storage_ptr__->ar = *(undefined8 *)piVar1;
    *(undefined8 *)(__return_storage_ptr__->ar + 2) = uVar2;
    __return_storage_ptr__->ar[4] = this->ar[(uint)i].ar[4];
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cerr,"Error in array limits: ");
}

Assistant:

T ArrayTP<T, n>::operator[](int i) const {
        //  same as previous?
        if(i < 0 || i > n) {
            //  cerr: something link console.error?
            std::cerr << "Error in array limits: " << i << " is out of range\n";
            //  exit: something like process.exit()?
            std::exit(EXIT_FAILURE);
        }
        //  this return an address, I.E a reference
        return ar[i];
    }